

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O0

void cjson_minify_should_remove_spaces(void)

{
  char *__dest;
  long in_FS_OFFSET;
  char *minified;
  char to_minify [21];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  minified = (char *)0x3a2279656b22207b;
  builtin_strncpy(to_minify,"\ttrue\r\n    }",0xd);
  __dest = (char *)malloc(0x15);
  if (__dest == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x3f);
  }
  strcpy(__dest,(char *)&minified);
  cJSON_Minify(__dest);
  UnityAssertEqualString("{\"key\":true}",__dest,(char *)0x0,0x43);
  free(__dest);
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff0) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_minify_should_remove_spaces(void)
{
    const char to_minify[] = "{ \"key\":\ttrue\r\n    }";

    char* minified = (char*) malloc(sizeof(to_minify));
    TEST_ASSERT_NOT_NULL(minified);
    strcpy(minified, to_minify);

    cJSON_Minify(minified);
    TEST_ASSERT_EQUAL_STRING("{\"key\":true}", minified);

    free(minified);
}